

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

whisper_context *
whisper_init_from_buffer_with_params(void *buffer,size_t buffer_size,whisper_context_params params)

{
  whisper_state *pwVar1;
  size_t in_stack_00000008;
  void *in_stack_00000010;
  whisper_context_params in_stack_00000020;
  whisper_context *ctx;
  whisper_context *in_stack_00001588;
  whisper_context *in_stack_ffffffffffffffb0;
  whisper_context *local_8;
  
  memcpy(&stack0xffffffffffffffb0,&stack0x00000008,0x30);
  local_8 = whisper_init_from_buffer_with_params_no_state
                      (in_stack_00000010,in_stack_00000008,in_stack_00000020);
  if (local_8 == (whisper_context *)0x0) {
    local_8 = (whisper_context *)0x0;
  }
  else {
    pwVar1 = whisper_init_state(in_stack_00001588);
    local_8->state = pwVar1;
    if (local_8->state == (whisper_state *)0x0) {
      whisper_free(in_stack_ffffffffffffffb0);
      local_8 = (whisper_context *)0x0;
    }
  }
  return local_8;
}

Assistant:

struct whisper_context * whisper_init_from_buffer_with_params(void * buffer, size_t buffer_size, struct whisper_context_params params) {
    whisper_context * ctx = whisper_init_from_buffer_with_params_no_state(buffer, buffer_size, params);
    if (!ctx) {
        return nullptr;
    }

    ctx->state = whisper_init_state(ctx);
    if (!ctx->state) {
        whisper_free(ctx);
        return nullptr;
    }

    return ctx;
}